

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

ON_String __thiscall ON_String::ToUTF8(ON_String *this,char *buffer,int buffer_length)

{
  uint *sUTF32;
  bool bVar1;
  Encoding EVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ON_Internal_Empty_aString *pOVar6;
  int iVar7;
  uint uVar8;
  size_t slen;
  ulong uVar9;
  ON_UnicodeShortCodePoint u;
  uint error_status;
  ON_Big5CodePoint big5_cp;
  ON_SimpleArray<unsigned_int> utf32;
  
  if (buffer != (char *)0x0) {
    uVar9 = (ulong)(uint)buffer_length;
    if (buffer_length == -1) {
      uVar9 = 0;
      do {
        if (buffer[uVar9] == '\0') goto LAB_005b7b07;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x7ffffffd);
      uVar9 = 0x7ffffffd;
    }
LAB_005b7b07:
    uVar4 = (uint)uVar9;
    if (0 < (int)uVar4) {
      utf32._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
      utf32.m_a = (uint *)0x0;
      utf32.m_count = 0;
      utf32.m_capacity = 0;
      EVar2 = ProbableEncoding(buffer,uVar4);
      if (EVar2 - ASCII < 2) {
        ON_String(this,buffer,uVar4);
      }
      else if (EVar2 == SloppyUTF8) {
        ON_String((ON_String *)&big5_cp,buffer,uVar4);
        ON_wString::ON_wString((ON_wString *)&error_status,(ON_String *)&big5_cp);
        ON_String(this,(ON_wString *)&error_status);
        ON_wString::~ON_wString((ON_wString *)&error_status);
        ~ON_String((ON_String *)&big5_cp);
      }
      else {
        uVar8 = 0;
        if (EVar2 == BIG5andASCII) {
          iVar7 = utf32.m_capacity;
          if (-1 < (long)utf32._16_8_) {
            utf32._16_8_ = (ulong)(uint)utf32.m_capacity << 0x20;
          }
          if ((uint)iVar7 < uVar4) {
            ON_SimpleArray<unsigned_int>::SetCapacity(&utf32,uVar9 & 0xffffffff);
          }
          iVar7 = 0;
          uVar9 = 0;
          do {
            if (buffer[uVar9] < '\0') {
              if ((int)uVar4 < (int)uVar9 + 2) {
LAB_005b7c44:
                error_status = 0xfffd;
                ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
                iVar7 = iVar7 + 1;
                goto LAB_005b7c5b;
              }
              big5_cp = ON_Big5CodePoint::Error;
              pcVar5 = ON_Big5CodePoint::Decode(buffer + uVar9,2,false,false,&big5_cp);
              if ((pcVar5 != buffer + uVar9 + 2) ||
                 (bVar1 = ON_Big5CodePoint::IsValid(&big5_cp,false,false), !bVar1))
              goto LAB_005b7c44;
              u = ON_UnicodeShortCodePoint::CreateFromBig5
                            (&big5_cp,ON_UnicodeShortCodePoint::ReplacementCharacter);
              bVar1 = ON_UnicodeShortCodePoint::IsReplacementCharacter(&u);
              error_status = ON_UnicodeShortCodePoint::UnicodeCodePoint(&u);
              ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
              iVar7 = iVar7 + (uint)bVar1;
              iVar3 = 2;
            }
            else {
              error_status = (int)buffer[uVar9];
              ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
LAB_005b7c5b:
              iVar3 = 1;
            }
            uVar8 = (int)uVar9 + iVar3;
            uVar9 = (ulong)uVar8;
          } while ((int)uVar8 < (int)uVar4);
          uVar8 = iVar7 * 2;
        }
        if ((utf32.m_count != 0) && (uVar8 <= (uint)utf32.m_count)) {
          error_status = 0;
          uVar4 = ON_ConvertUTF32ToUTF8
                            (0,utf32.m_a,utf32.m_count,(char *)0x0,0,&error_status,0xffffffff,0xfffd
                             ,(ON__UINT32 **)0x0);
          if (0 < (int)uVar4) {
            error_status = 0;
            ON_String(this);
            ReserveArray(this,(ulong)uVar4);
            SetLength(this,(ulong)uVar4);
            sUTF32 = utf32.m_a;
            iVar7 = utf32.m_count;
            CopyArray(this);
            pcVar5 = this->m_s;
            pOVar6 = &empty_astring;
            if (pcVar5 != (char *)0x0) {
              pOVar6 = (ON_Internal_Empty_aString *)(pcVar5 + -0xc);
            }
            if ((pOVar6->header).string_capacity < 1) {
              pcVar5 = (char *)0x0;
            }
            ON_ConvertUTF32ToUTF8
                      (0,sUTF32,iVar7,pcVar5,uVar4,&error_status,0xffffffff,0xfffd,
                       (ON__UINT32 **)0x0);
            goto LAB_005b7db6;
          }
        }
        ON_String(this,&EmptyString);
      }
LAB_005b7db6:
      ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&utf32);
      return (ON_String)(char *)this;
    }
  }
  ON_String(this,&EmptyString);
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToUTF8(
  const char* buffer,
  int buffer_length
)
{
  if (nullptr == buffer)
    return ON_String::EmptyString;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0)
    return ON_String::EmptyString;

  unsigned bad_utf32_count = 0;
  ON_SimpleArray<ON__UINT32> utf32;

  const ON_String::Encoding e = ON_String::ProbableEncoding(buffer, buffer_length);
  switch (e)
  {
  case ON_String::Encoding::ASCII:
  case ON_String::Encoding::UTF8:
    return ON_String(buffer, buffer_length);
    break;

  case ON_String::Encoding::SloppyUTF8:
    // ON_String -> ON_wString cleans up the slop.
    // ON_wString -> ON_String converts the wchar_t UTF-X encoding to UTF-8.
    return ON_String(ON_wString(ON_String(buffer, buffer_length)));
    break;

  case ON_String::Encoding::BIG5andASCII:
    bad_utf32_count = Internal_Big5ToUTF32(buffer, buffer_length, utf32);
    break;

  default:
    break;
  }

  const unsigned utf32_count = utf32.UnsignedCount();
  if (utf32_count > 0 && utf32_count >= 2* bad_utf32_count)
  {
    unsigned int error_status = 0;
    const unsigned int error_mask = 0xFFFFFFFFu;
    const int utf8_count = ON_ConvertUTF32ToUTF8(
      false, // bTestByteOrder,
      utf32.Array(),
      utf32.Count(),
      nullptr, // char* sUTF8,
      0, // int sUTF8_count,
      &error_status,
      error_mask,
      ON_UnicodeCodePoint::ON_ReplacementCharacter,
      nullptr //const ON__UINT32 * *sNextUTF32
    );
    if (utf8_count > 0)
    {
      error_status = 0;
      ON_String utf8;
      utf8.ReserveArray(utf8_count);
      utf8.SetLength(utf8_count);
      ON_ConvertUTF32ToUTF8(
        false, // bTestByteOrder,
        utf32.Array(),
        utf32.Count(),
        utf8.Array(),
        utf8_count,
        &error_status,
        error_mask,
        ON_UnicodeCodePoint::ON_ReplacementCharacter,
        nullptr //const ON__UINT32 * *sNextUTF32
      );
      return utf8;
    }
  }

  return ON_String::EmptyString;
}